

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O0

void __thiscall
GdlLangClass::AddFeatureValue
          (GdlLangClass *this,string *staFeat,string *staVal,GdlExpression *pexpVal,
          GrpLineAndFile *lnf)

{
  value_type *in_RDI;
  vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *in_R8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_R8,(value_type *)in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_R8,(value_type *)in_RDI);
  std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
            (in_R8,(value_type *)in_RDI);
  std::vector<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>::push_back
            ((vector<GrpLineAndFile,_std::allocator<GrpLineAndFile>_> *)in_R8,in_RDI);
  return;
}

Assistant:

void AddFeatureValue(std::string staFeat, std::string staVal,
		GdlExpression * pexpVal, GrpLineAndFile lnf)
	{
		m_vstaFeat.push_back(staFeat);
		m_vstaVal.push_back(staVal);
		m_vpexpVal.push_back(pexpVal);
		m_vlnf.push_back(lnf);
		Assert(m_vstaFeat.size() == m_vstaVal.size());
		Assert(m_vstaFeat.size() == m_vpexpVal.size());
		Assert(m_vstaFeat.size() == m_vlnf.size());
	}